

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

VRle __thiscall VRasterizer::rle(VRasterizer *this)

{
  bool bVar1;
  __shared_ptr *in_RSI;
  model *in_RDI;
  vcow_ptr<VRle::Data> this_00;
  
  this_00.mModel = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    std::__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x132192);
    VRasterizerImpl::rle((VRasterizerImpl *)0x13219a);
    VRle::VRle((VRle *)this_00.mModel,(VRle *)in_RDI);
  }
  else {
    memset(in_RDI,0,8);
    VRle::VRle((VRle *)0x132186);
  }
  return (VRle)(vcow_ptr<VRle::Data>)this_00.mModel;
}

Assistant:

VRle VRasterizer::rle()
{
    if (!d) return VRle();
    return d->rle();
}